

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void __thiscall wallet::WalletInit::Construct(WalletInit *this,NodeContext *node)

{
  string_view source_file;
  byte bVar1;
  type pCVar2;
  pointer pWVar3;
  long in_RSI;
  LogFlags in_RDI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  ArgsManager *args;
  unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_> wallet_loader
  ;
  Level in_stack_000000e0;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  ArgsManager *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  char *in_stack_ffffffffffffff50;
  unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_> *__args;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff58;
  vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
  *this_00;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined8 in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  allocator<char> *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffffac;
  allocator<char> local_29 [17];
  ConstevalFormatString<0U> in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  char *pcVar4;
  
  pcVar4 = *(char **)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,ArgsManager*&>
            ((ArgsManager **)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             (char *)in_stack_ffffffffffffff58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar1 = ArgsManager::GetBoolArg
                    (in_stack_ffffffffffffff40,
                     (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (bool)in_stack_ffffffffffffff4f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::allocator<char>::~allocator(local_29);
  if ((bVar1 & 1) == 0) {
    __args = *(unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
               **)(in_RSI + 0x10);
    pCVar2 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator*
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    this_00 = (vector<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
               *)&stack0xffffffffffffffa8;
    (*(code *)(__args->_M_t).
              super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
              ._M_t.
              super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
              .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl[5].
              super_ChainClient._vptr_ChainClient)(this_00,__args,pCVar2);
    pWVar3 = std::
             unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>::
             get((unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
                  *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    *(pointer *)(in_RSI + 0xa8) = pWVar3;
    std::
    vector<std::unique_ptr<interfaces::ChainClient,std::default_delete<interfaces::ChainClient>>,std::allocator<std::unique_ptr<interfaces::ChainClient,std::default_delete<interfaces::ChainClient>>>>
    ::
    emplace_back<std::unique_ptr<interfaces::WalletLoader,std::default_delete<interfaces::WalletLoader>>>
              (this_00,__args);
    std::unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>::
    ~unique_ptr((unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
                 *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    source_file._M_str = pcVar4;
    source_file._M_len = in_stack_fffffffffffffff0;
    LogPrintFormatInternal<>
              (in_stack_00000000,source_file,in_stack_ffffffffffffffac,in_RDI,in_stack_000000e0,
               in_stack_ffffffffffffffe8);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletInit::Construct(NodeContext& node) const
{
    ArgsManager& args = *Assert(node.args);
    if (args.GetBoolArg("-disablewallet", DEFAULT_DISABLE_WALLET)) {
        LogPrintf("Wallet disabled!\n");
        return;
    }
    auto wallet_loader = node.init->makeWalletLoader(*node.chain);
    node.wallet_loader = wallet_loader.get();
    node.chain_clients.emplace_back(std::move(wallet_loader));
}